

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part.c
# Opt level: O2

exr_result_t
exr_get_chunk_unpacked_size(exr_const_context_t_conflict ctxt,int part_index,uint64_t *out)

{
  uint64_t uVar1;
  uint8_t uVar2;
  exr_result_t eVar3;
  exr_context_t nonc;
  
  if (ctxt == (exr_const_context_t_conflict)0x0) {
    return 2;
  }
  if (ctxt->mode == '\x01') {
    pthread_mutex_lock((pthread_mutex_t *)&ctxt->mutex);
  }
  if (part_index < 0) {
    uVar2 = ctxt->mode;
  }
  else {
    uVar2 = ctxt->mode;
    if (part_index < ctxt->num_parts) {
      uVar1 = ctxt->parts[(uint)part_index]->unpacked_size_per_chunk;
      if (uVar2 == '\x01') {
        pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
      }
      if (out != (uint64_t *)0x0) {
        *out = uVar1;
        return 0;
      }
      eVar3 = (*ctxt->standard_error)(ctxt,3);
      return eVar3;
    }
  }
  if (uVar2 == '\x01') {
    pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
  }
  eVar3 = (*ctxt->print_error)
                    (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,ctxt->print_error
                    );
  return eVar3;
}

Assistant:

exr_result_t
exr_get_chunk_unpacked_size (
    exr_const_context_t ctxt, int part_index, uint64_t* out)
{
    uint64_t sz;
    EXR_LOCK_WRITE_AND_DEFINE_PART (part_index);
    sz = part->unpacked_size_per_chunk;
    if (ctxt->mode == EXR_CONTEXT_WRITE) internal_exr_unlock (ctxt);

    if (!out) return ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT);

    *out = sz;
    return EXR_ERR_SUCCESS;
}